

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void __thiscall
duckdb::IntervalConversionUs
          (duckdb *this,Vector *vector,ArrowArray *array,ArrowScanLocalState *scan_state,
          int64_t nested_offset,int64_t parent_offset,idx_t size,int64_t conversion)

{
  bool bVar1;
  ConversionException *this_00;
  VectorType *pVVar2;
  duckdb *result;
  idx_t iVar3;
  string local_50;
  
  pVVar2 = &vector->vector_type +
           (long)&(scan_state->super_LocalTableFunctionState)._vptr_LocalTableFunctionState +
           parent_offset;
  if (nested_offset != -1) {
    pVVar2 = &vector->vector_type + nested_offset;
  }
  if (size != 0) {
    result = this + 8;
    iVar3 = 0;
    do {
      *(int64_t *)(result + -8) = 0;
      bVar1 = TryMultiplyOperator::Operation<long,long,long>
                        ((&array->length)[(long)(pVVar2 + iVar3)],conversion,(int64_t *)result);
      if (!bVar1) {
        this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Could not convert Interval to Microsecond","");
        ConversionException::ConversionException(this_00,&local_50);
        __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar3 = iVar3 + 1;
      result = result + 0x10;
    } while (size != iVar3);
  }
  return;
}

Assistant:

static void IntervalConversionUs(Vector &vector, ArrowArray &array, const ArrowScanLocalState &scan_state,
                                 int64_t nested_offset, int64_t parent_offset, idx_t size, int64_t conversion) {
	auto tgt_ptr = FlatVector::GetData<interval_t>(vector);
	auto src_ptr =
	    ArrowBufferData<int64_t>(array, 1) + GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
	for (idx_t row = 0; row < size; row++) {
		tgt_ptr[row].days = 0;
		tgt_ptr[row].months = 0;
		if (!TryMultiplyOperator::Operation(src_ptr[row], conversion, tgt_ptr[row].micros)) {
			throw ConversionException("Could not convert Interval to Microsecond");
		}
	}
}